

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file_into.c
# Opt level: O0

_Bool read_file_into(BinarySink *bs,FILE *fp)

{
  int iVar1;
  size_t len;
  size_t retd;
  char buf [4096];
  FILE *fp_local;
  BinarySink *bs_local;
  
  buf._4088_8_ = fp;
  while( true ) {
    len = fread(&retd,1,0x1000,(FILE *)buf._4088_8_);
    if (len == 0) break;
    BinarySink_put_data(bs->binarysink_,&retd,len);
  }
  iVar1 = ferror((FILE *)buf._4088_8_);
  return (_Bool)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

bool read_file_into(BinarySink *bs, FILE *fp)
{
    char buf[4096];
    while (1) {
        size_t retd = fread(buf, 1, sizeof(buf), fp);
        if (retd == 0)
            return !ferror(fp);
        put_data(bs, buf, retd);
    }
}